

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROM.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
readBytesFromFile(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                 string *fileName)

{
  char cVar1;
  size_type __new_size;
  ifstream imageDataStream;
  char acStack_218 [520];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(acStack_218,(string *)fileName,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::seekg((long)acStack_218,_S_beg);
    __new_size = std::istream::tellg();
    std::istream::seekg((long)acStack_218,_S_beg);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (__return_storage_ptr__,__new_size);
    std::istream::read(acStack_218,
                       (long)(__return_storage_ptr__->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
    std::ifstream::close();
    if ((__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage !=
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>::
      _S_do_it(__return_storage_ptr__);
    }
  }
  std::ifstream::~ifstream(acStack_218);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> readBytesFromFile(const std::string &fileName)
{
    std::vector<uint8_t> vec;
    std::ifstream imageDataStream(fileName, std::ifstream::in | std::ifstream::binary);

    if(!imageDataStream.is_open()) {
        return vec;
    }

    imageDataStream.seekg(0, std::ios_base::end);
    const auto fileSize = imageDataStream.tellg();
    imageDataStream.seekg(0, std::ios_base::beg);

    vec.resize(fileSize);
    char *target = reinterpret_cast<char*>(&vec[0]);

    imageDataStream.read(target, fileSize);
    imageDataStream.close();

    vec.shrink_to_fit();

    return vec;
}